

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqvm.cpp
# Opt level: O3

void __thiscall SQVM::CloseOuters(SQVM *this,SQObjectPtr *stackindex)

{
  SQUnsignedInteger *pSVar1;
  SQObjectType SVar2;
  SQObjectType SVar3;
  SQObjectPtr *pSVar4;
  SQTable *pSVar5;
  SQTable *pSVar6;
  SQOuter *pSVar7;
  SQOuter *pSVar8;
  
  pSVar7 = this->_openouters;
  while ((pSVar8 = pSVar7, pSVar8 != (SQOuter *)0x0 &&
         (pSVar4 = pSVar8->_valptr, stackindex <= pSVar4))) {
    SVar2 = (pSVar8->_value).super_SQObject._type;
    pSVar5 = (pSVar8->_value).super_SQObject._unVal.pTable;
    pSVar6 = (pSVar4->super_SQObject)._unVal.pTable;
    (pSVar8->_value).super_SQObject._unVal.pTable = pSVar6;
    SVar3 = (pSVar4->super_SQObject)._type;
    (pSVar8->_value).super_SQObject._type = SVar3;
    if ((SVar3 >> 0x1b & 1) != 0) {
      pSVar1 = &(pSVar6->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
      *pSVar1 = *pSVar1 + 1;
    }
    if ((SVar2 >> 0x1b & 1) != 0) {
      pSVar1 = &(pSVar5->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
      *pSVar1 = *pSVar1 - 1;
      if (*pSVar1 == 0) {
        (*(pSVar5->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted[2])
                  ();
      }
    }
    pSVar8->_valptr = &pSVar8->_value;
    pSVar7 = pSVar8->_next;
    this->_openouters = pSVar7;
    pSVar1 = &(pSVar8->super_SQCollectable).super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 - 1;
    if (*pSVar1 == 0) {
      (*(pSVar8->super_SQCollectable).super_SQRefCounted._vptr_SQRefCounted[2])(pSVar8);
      pSVar7 = this->_openouters;
    }
  }
  return;
}

Assistant:

void SQVM::CloseOuters(SQObjectPtr *stackindex) {
  SQOuter *p;
  while ((p = _openouters) != NULL && p->_valptr >= stackindex) {
    p->_value = *(p->_valptr);
    p->_valptr = &p->_value;
    _openouters = p->_next;
    __ObjRelease(p);
  }
}